

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalKdevelopGenerator::CreateNewProjectFile
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *filename,
          string *executable,string *cmakeFilePattern,string *fileToOpen,string *sessionFilename)

{
  cmGlobalGenerator *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  pointer value;
  cmXMLWriter sesxml;
  cmGeneratedFileStream devses;
  string primaryLanguage;
  cmGeneratedFileStream fout;
  bool local_5bb;
  allocator local_5b9;
  cmXMLWriter local_5b8;
  char local_561;
  cmXMLWriter local_560;
  allocator local_509;
  string local_508;
  cmGeneratedFileStream local_4e8;
  string *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [584];
  
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false,None);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) != 0)
  goto LAB_0031e4b3;
  local_2a0 = cmakeFilePattern;
  cmXMLWriter::cmXMLWriter(&local_5b8,(ostream *)local_278,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e8,
                 projectDir,"/.svn");
  bVar2 = cmsys::SystemTools::FileExists
                    ((char *)CONCAT44(local_4e8.super_ofstream.
                                      super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream._4_4_,
                                      local_4e8.super_ofstream.
                                      super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream._0_4_));
  std::__cxx11::string::~string((string *)&local_4e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e8,
                 projectDir,"/CVS");
  local_561 = cmsys::SystemTools::FileExists
                        ((char *)CONCAT44(local_4e8.super_ofstream.
                                          super_basic_ostream<char,_std::char_traits<char>_>.
                                          _vptr_basic_ostream._4_4_,
                                          local_4e8.super_ofstream.
                                          super_basic_ostream<char,_std::char_traits<char>_>.
                                          _vptr_basic_ostream._0_4_));
  std::__cxx11::string::~string((string *)&local_4e8);
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::__cxx11::string::string((string *)&local_4e8,"C",(allocator *)&local_298);
  bVar3 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,(string *)&local_4e8);
  local_5bb = true;
  if (!bVar3) {
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    std::__cxx11::string::string((string *)&local_560,"CXX",(allocator *)&local_508);
    local_5bb = cmGlobalGenerator::GetLanguageEnabled(pcVar1,(string *)&local_560);
    std::__cxx11::string::~string((string *)&local_560);
  }
  std::__cxx11::string::~string((string *)&local_4e8);
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::__cxx11::string::string((string *)&local_4e8,"Fortran",(allocator *)&local_560);
  bVar3 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_298,"C++",(allocator *)&local_4e8);
  if (bVar3 && local_5bb == false) {
    std::__cxx11::string::assign((char *)&local_298);
  }
  cmXMLWriter::StartDocument(&local_5b8,"UTF-8");
  std::__cxx11::string::string((string *)&local_4e8,"kdevelop",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"general",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"author",(allocator *)&local_560);
  cmXMLWriter::Element<char[1]>(&local_5b8,(string *)&local_4e8,(char (*) [1])0x53a5ca);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"email",(allocator *)&local_560);
  cmXMLWriter::Element<char[1]>(&local_5b8,(string *)&local_4e8,(char (*) [1])0x53a5ca);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"version",(allocator *)&local_560);
  cmXMLWriter::Element<char[10]>(&local_5b8,(string *)&local_4e8,(char (*) [10])"$VERSION$");
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"projectmanagement",(allocator *)&local_560);
  cmXMLWriter::Element<char[18]>(&local_5b8,(string *)&local_4e8,(char (*) [18])"KDevCustomProject")
  ;
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"primarylanguage",(allocator *)&local_560);
  cmXMLWriter::Element<std::__cxx11::string>(&local_5b8,(string *)&local_4e8,&local_298);
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::Element(&local_5b8,"ignoreparts");
  std::__cxx11::string::string((string *)&local_4e8,"projectdirectory",(allocator *)&local_560);
  cmXMLWriter::Element<std::__cxx11::string>(&local_5b8,(string *)&local_4e8,projectDir);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"absoluteprojectpath",(allocator *)&local_560);
  cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x51470e);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"secondaryLanguages",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  if ((local_5bb & bVar3) == 1) {
    std::__cxx11::string::string((string *)&local_4e8,"language",(allocator *)&local_560);
    cmXMLWriter::Element<char[8]>(&local_5b8,(string *)&local_4e8,(char (*) [8])0x52d3fc);
    std::__cxx11::string::~string((string *)&local_4e8);
  }
  if (local_5bb != false) {
    std::__cxx11::string::string((string *)&local_4e8,"language",(allocator *)&local_560);
    cmXMLWriter::Element<char[2]>(&local_5b8,(string *)&local_4e8,(char (*) [2])0x504fdb);
    std::__cxx11::string::~string((string *)&local_4e8);
  }
  cmXMLWriter::EndElement(&local_5b8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_4e8,"versioncontrol",(allocator *)&local_560);
    cmXMLWriter::Element<char[15]>(&local_5b8,(string *)&local_4e8,(char (*) [15])"kdevsubversion");
LAB_0031cc79:
    std::__cxx11::string::~string((string *)&local_4e8);
  }
  else if (local_561 != '\0') {
    std::__cxx11::string::string((string *)&local_4e8,"versioncontrol",(allocator *)&local_560);
    cmXMLWriter::Element<char[15]>(&local_5b8,(string *)&local_4e8,(char (*) [15])"kdevcvsservice");
    goto LAB_0031cc79;
  }
  cmXMLWriter::EndElement(&local_5b8);
  std::__cxx11::string::string((string *)&local_4e8,"kdevcustomproject",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"filelistdirectory",(allocator *)&local_560);
  cmXMLWriter::Element<std::__cxx11::string>(&local_5b8,(string *)&local_4e8,outputDir);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"run",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"mainprogram",(allocator *)&local_560);
  cmXMLWriter::Element<std::__cxx11::string>(&local_5b8,(string *)&local_4e8,executable);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"directoryradio",(allocator *)&local_560);
  cmXMLWriter::Element<char[7]>(&local_5b8,(string *)&local_4e8,(char (*) [7])0x518dd0);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"customdirectory",(allocator *)&local_560);
  cmXMLWriter::Element<std::__cxx11::string>(&local_5b8,(string *)&local_4e8,outputDir);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"programargs",(allocator *)&local_560);
  cmXMLWriter::Element<char[1]>(&local_5b8,(string *)&local_4e8,(char (*) [1])0x53a5ca);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"terminal",(allocator *)&local_560);
  cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"autocompile",(allocator *)&local_560);
  cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x51470e);
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::Element(&local_5b8,"envvars");
  cmXMLWriter::EndElement(&local_5b8);
  std::__cxx11::string::string((string *)&local_4e8,"build",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"buildtool",(allocator *)&local_560);
  cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x51e27d);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"builddir",(allocator *)&local_560);
  cmXMLWriter::Element<std::__cxx11::string>(&local_5b8,(string *)&local_4e8,outputDir);
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::EndElement(&local_5b8);
  std::__cxx11::string::string((string *)&local_4e8,"make",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"abortonerror",(allocator *)&local_560);
  cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"numberofjobs",(allocator *)&local_508);
  local_560.Output._0_4_ = 1;
  cmXMLWriter::Element<int>(&local_5b8,(string *)&local_4e8,(int *)&local_560);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"dontact",(allocator *)&local_560);
  cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"makebin",&local_5b9);
  this_00 = (*(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start)->Makefile;
  std::__cxx11::string::string((string *)&local_560,"CMAKE_MAKE_PROGRAM",&local_509);
  local_508._M_dataplus._M_p = cmMakefile::GetRequiredDefinition(this_00,(string *)&local_560);
  cmXMLWriter::Element<char_const*>(&local_5b8,(string *)&local_4e8,(char **)&local_508);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"selectedenvironment",(allocator *)&local_560);
  cmXMLWriter::Element<char[8]>(&local_5b8,(string *)&local_4e8,(char (*) [8])0x54ffbb);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"environments",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"default",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"envvar",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  local_4e8.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
  _0_4_ = 1;
  cmXMLWriter::Attribute<int>(&local_5b8,"value",(int *)&local_4e8);
  cmXMLWriter::Attribute<char[8]>(&local_5b8,"name",(char (*) [8])0x5063d8);
  cmXMLWriter::EndElement(&local_5b8);
  std::__cxx11::string::string((string *)&local_4e8,"envvar",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  local_4e8.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
  _0_4_ = 1;
  cmXMLWriter::Attribute<int>(&local_5b8,"value",(int *)&local_4e8);
  cmXMLWriter::Attribute<char[17]>(&local_5b8,"name",(char (*) [17])"CMAKE_NO_VERBOSE");
  cmXMLWriter::EndElement(&local_5b8);
  cmXMLWriter::EndElement(&local_5b8);
  cmXMLWriter::EndElement(&local_5b8);
  cmXMLWriter::EndElement(&local_5b8);
  std::__cxx11::string::string((string *)&local_4e8,"blacklist",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  for (value = (this->Blacklist).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      value != (this->Blacklist).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; value = value + 1) {
    std::__cxx11::string::string((string *)&local_4e8,"path",(allocator *)&local_560);
    cmXMLWriter::Element<std::__cxx11::string>(&local_5b8,(string *)&local_4e8,value);
    std::__cxx11::string::~string((string *)&local_4e8);
  }
  cmXMLWriter::EndElement(&local_5b8);
  cmXMLWriter::EndElement(&local_5b8);
  std::__cxx11::string::string((string *)&local_4e8,"kdevfilecreate",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::Element(&local_5b8,"filetypes");
  std::__cxx11::string::string((string *)&local_4e8,"useglobaltypes",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"type",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::Attribute<char[3]>(&local_5b8,"ext",(char (*) [3])0x512885);
  cmXMLWriter::EndElement(&local_5b8);
  std::__cxx11::string::string((string *)&local_4e8,"type",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::Attribute<char[4]>(&local_5b8,"ext",(char (*) [4])0x55cd9d);
  cmXMLWriter::EndElement(&local_5b8);
  std::__cxx11::string::string((string *)&local_4e8,"type",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::Attribute<char[2]>(&local_5b8,"ext",(char (*) [2])0x5099b5);
  cmXMLWriter::EndElement(&local_5b8);
  cmXMLWriter::EndElement(&local_5b8);
  cmXMLWriter::EndElement(&local_5b8);
  std::__cxx11::string::string((string *)&local_4e8,"kdevdoctreeview",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"projectdoc",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"userdocDir",(allocator *)&local_560);
  cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])"html/");
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"apidocDir",(allocator *)&local_560);
  cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])"html/");
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::EndElement(&local_5b8);
  cmXMLWriter::Element(&local_5b8,"ignoreqt_xml");
  cmXMLWriter::Element(&local_5b8,"ignoredoxygen");
  cmXMLWriter::Element(&local_5b8,"ignorekdocs");
  cmXMLWriter::Element(&local_5b8,"ignoretocs");
  cmXMLWriter::Element(&local_5b8,"ignoredevhelp");
  cmXMLWriter::EndElement(&local_5b8);
  if (local_5bb != false) {
    std::__cxx11::string::string((string *)&local_4e8,"cppsupportpart",(allocator *)&local_560);
    cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"filetemplates",(allocator *)&local_560);
    cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"interfacesuffix",(allocator *)&local_560);
    cmXMLWriter::Element<char[3]>(&local_5b8,(string *)&local_4e8,(char (*) [3])0x50360e);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string
              ((string *)&local_4e8,"implementationsuffix",(allocator *)&local_560);
    cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x55cd9c);
    std::__cxx11::string::~string((string *)&local_4e8);
    cmXMLWriter::EndElement(&local_5b8);
    cmXMLWriter::EndElement(&local_5b8);
    std::__cxx11::string::string((string *)&local_4e8,"kdevcppsupport",(allocator *)&local_560);
    cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"codecompletion",(allocator *)&local_560);
    cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string
              ((string *)&local_4e8,"includeGlobalFunctions",(allocator *)&local_560);
    cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x51470e);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"includeTypes",(allocator *)&local_560);
    cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x51470e);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"includeEnums",(allocator *)&local_560);
    cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x51470e);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"includeTypedefs",(allocator *)&local_560);
    cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string
              ((string *)&local_4e8,"automaticCodeCompletion",(allocator *)&local_560);
    cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x51470e);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string
              ((string *)&local_4e8,"automaticArgumentsHint",(allocator *)&local_560);
    cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x51470e);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string
              ((string *)&local_4e8,"automaticHeaderCompletion",(allocator *)&local_560);
    cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x51470e);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"codeCompletionDelay",(allocator *)&local_508)
    ;
    local_560.Output._0_4_ = 0xfa;
    cmXMLWriter::Element<int>(&local_5b8,(string *)&local_4e8,(int *)&local_560);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"argumentsHintDelay",(allocator *)&local_508);
    local_560.Output._0_4_ = 400;
    cmXMLWriter::Element<int>(&local_5b8,(string *)&local_4e8,(int *)&local_560);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string
              ((string *)&local_4e8,"headerCompletionDelay",(allocator *)&local_508);
    local_560.Output._0_4_ = 0xfa;
    cmXMLWriter::Element<int>(&local_5b8,(string *)&local_4e8,(int *)&local_560);
    std::__cxx11::string::~string((string *)&local_4e8);
    cmXMLWriter::EndElement(&local_5b8);
    cmXMLWriter::Element(&local_5b8,"references");
    cmXMLWriter::EndElement(&local_5b8);
  }
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_4e8,"kdevfortransupport",(allocator *)&local_560);
    cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"ftnchek",(allocator *)&local_560);
    cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"division",(allocator *)&local_560);
    cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"extern",(allocator *)&local_560);
    cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"declare",(allocator *)&local_560);
    cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"pure",(allocator *)&local_560);
    cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"argumentsall",(allocator *)&local_560);
    cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"commonall",(allocator *)&local_560);
    cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"truncationall",(allocator *)&local_560);
    cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"usageall",(allocator *)&local_560);
    cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"f77all",(allocator *)&local_560);
    cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::string((string *)&local_4e8,"portabilityall",(allocator *)&local_560);
    cmXMLWriter::Element<char[6]>(&local_5b8,(string *)&local_4e8,(char (*) [6])0x52ed35);
    std::__cxx11::string::~string((string *)&local_4e8);
    cmXMLWriter::Element(&local_5b8,"argumentsonly");
    cmXMLWriter::Element(&local_5b8,"commononly");
    cmXMLWriter::Element(&local_5b8,"truncationonly");
    cmXMLWriter::Element(&local_5b8,"usageonly");
    cmXMLWriter::Element(&local_5b8,"f77only");
    cmXMLWriter::Element(&local_5b8,"portabilityonly");
    cmXMLWriter::EndElement(&local_5b8);
    cmXMLWriter::EndElement(&local_5b8);
  }
  std::__cxx11::string::string((string *)&local_4e8,"kdevfileview",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"groups",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"group",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::Attribute<std::__cxx11::string>(&local_5b8,"pattern",local_2a0);
  cmXMLWriter::Attribute<char[6]>(&local_5b8,"name",(char (*) [6])0x51cfa1);
  cmXMLWriter::EndElement(&local_5b8);
  if (local_5bb != false) {
    std::__cxx11::string::string((string *)&local_4e8,"group",(allocator *)&local_560);
    cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    cmXMLWriter::Attribute<char[16]>(&local_5b8,"pattern",(char (*) [16])"*.h;*.hxx;*.hpp");
    cmXMLWriter::Attribute<char[7]>(&local_5b8,"name",(char (*) [7])0x51925f);
    cmXMLWriter::EndElement(&local_5b8);
    std::__cxx11::string::string((string *)&local_4e8,"group",(allocator *)&local_560);
    cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    cmXMLWriter::Attribute<char[4]>(&local_5b8,"pattern",(char (*) [4])"*.c");
    cmXMLWriter::Attribute<char[10]>(&local_5b8,"name",(char (*) [10])"C Sources");
    cmXMLWriter::EndElement(&local_5b8);
    std::__cxx11::string::string((string *)&local_4e8,"group",(allocator *)&local_560);
    cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    cmXMLWriter::Attribute<char[21]>(&local_5b8,"pattern",(char (*) [21])"*.cpp;*.C;*.cxx;*.cc");
    cmXMLWriter::Attribute<char[12]>(&local_5b8,"name",(char (*) [12])"C++ Sources");
    cmXMLWriter::EndElement(&local_5b8);
  }
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_4e8,"group",(allocator *)&local_560);
    cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    cmXMLWriter::Attribute<char[50]>
              (&local_5b8,"pattern",
               (char (*) [50])"*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;*.F95");
    cmXMLWriter::Attribute<char[16]>(&local_5b8,"name",(char (*) [16])"Fortran Sources");
    cmXMLWriter::EndElement(&local_5b8);
  }
  std::__cxx11::string::string((string *)&local_4e8,"group",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::Attribute<char[5]>(&local_5b8,"pattern",(char (*) [5])"*.ui");
  cmXMLWriter::Attribute<char[18]>(&local_5b8,"name",(char (*) [18])"Qt Designer files");
  cmXMLWriter::EndElement(&local_5b8);
  std::__cxx11::string::string((string *)&local_4e8,"hidenonprojectfiles",(allocator *)&local_560);
  cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x51470e);
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::EndElement(&local_5b8);
  std::__cxx11::string::string((string *)&local_4e8,"tree",(allocator *)&local_560);
  cmXMLWriter::StartElement(&local_5b8,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"hidepatterns",(allocator *)&local_560);
  cmXMLWriter::Element<char[23]>
            (&local_5b8,(string *)&local_4e8,(char (*) [23])"*.o,*.lo,CVS,*~,cmake*");
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::string((string *)&local_4e8,"hidenonprojectfiles",(allocator *)&local_560);
  cmXMLWriter::Element<char[5]>(&local_5b8,(string *)&local_4e8,(char (*) [5])0x51470e);
  std::__cxx11::string::~string((string *)&local_4e8);
  cmXMLWriter::EndElement(&local_5b8);
  cmXMLWriter::EndElement(&local_5b8);
  cmXMLWriter::EndElement(&local_5b8);
  cmXMLWriter::EndDocument(&local_5b8);
  if (sessionFilename->_M_string_length != 0) {
    cmGeneratedFileStream::cmGeneratedFileStream
              (&local_4e8,(sessionFilename->_M_dataplus)._M_p,false,None);
    if (((&local_4e8.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [*(long *)(CONCAT44(local_4e8.super_ofstream.
                             super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                             _4_4_,local_4e8.super_ofstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream._0_4_) + -0x18)] & 5) == 0) {
      cmXMLWriter::cmXMLWriter(&local_560,(ostream *)&local_4e8,0);
      cmXMLWriter::StartDocument(&local_560,"UTF-8");
      cmXMLWriter::Doctype(&local_560,"KDevPrjSession");
      std::__cxx11::string::string((string *)&local_508,"KDevPrjSession",&local_5b9);
      cmXMLWriter::StartElement(&local_560,&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::string((string *)&local_508,"DocsAndViews",&local_5b9);
      cmXMLWriter::StartElement(&local_560,&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      local_508._M_dataplus._M_p._0_4_ = 1;
      cmXMLWriter::Attribute<int>(&local_560,"NumberOfDocuments",(int *)&local_508);
      std::__cxx11::string::string((string *)&local_508,"Doc0",&local_5b9);
      cmXMLWriter::StartElement(&local_560,&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      local_508._M_dataplus._M_p._0_4_ = 1;
      cmXMLWriter::Attribute<int>(&local_560,"NumberOfViews",(int *)&local_508);
      std::operator+(&local_508,"file://",fileToOpen);
      cmXMLWriter::Attribute<std::__cxx11::string>(&local_560,"URL",&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::string((string *)&local_508,"View0",&local_5b9);
      cmXMLWriter::StartElement(&local_560,&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      local_508._M_dataplus._M_p = (pointer)((ulong)local_508._M_dataplus._M_p._4_4_ << 0x20);
      cmXMLWriter::Attribute<int>(&local_560,"line",(int *)&local_508);
      cmXMLWriter::Attribute<char[7]>(&local_560,"Type",(char (*) [7])0x52dc4c);
      cmXMLWriter::EndElement(&local_560);
      cmXMLWriter::EndElement(&local_560);
      cmXMLWriter::EndElement(&local_560);
      cmXMLWriter::EndElement(&local_560);
      cmXMLWriter::~cmXMLWriter(&local_560);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_4e8);
  }
  std::__cxx11::string::~string((string *)&local_298);
  cmXMLWriter::~cmXMLWriter(&local_5b8);
LAB_0031e4b3:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmGlobalKdevelopGenerator::CreateNewProjectFile(
  const std::string& outputDir, const std::string& projectDir,
  const std::string& filename, const std::string& executable,
  const std::string& cmakeFilePattern, const std::string& fileToOpen,
  const std::string& sessionFilename)
{
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }
  cmXMLWriter xml(fout);

  // check for a version control system
  bool hasSvn = cmSystemTools::FileExists((projectDir + "/.svn").c_str());
  bool hasCvs = cmSystemTools::FileExists((projectDir + "/CVS").c_str());

  bool enableCxx = (this->GlobalGenerator->GetLanguageEnabled("C") ||
                    this->GlobalGenerator->GetLanguageEnabled("CXX"));
  bool enableFortran = this->GlobalGenerator->GetLanguageEnabled("Fortran");
  std::string primaryLanguage = "C++";
  if (enableFortran && !enableCxx) {
    primaryLanguage = "Fortran77";
  }

  xml.StartDocument();
  xml.StartElement("kdevelop");
  xml.StartElement("general");

  xml.Element("author", "");
  xml.Element("email", "");
  xml.Element("version", "$VERSION$");
  xml.Element("projectmanagement", "KDevCustomProject");
  xml.Element("primarylanguage", primaryLanguage);
  xml.Element("ignoreparts");
  xml.Element("projectdirectory", projectDir); // this one is important
  xml.Element("absoluteprojectpath", "true");  // and this one

  // setup additional languages
  xml.StartElement("secondaryLanguages");
  if (enableFortran && enableCxx) {
    xml.Element("language", "Fortran");
  }
  if (enableCxx) {
    xml.Element("language", "C");
  }
  xml.EndElement();

  if (hasSvn) {
    xml.Element("versioncontrol", "kdevsubversion");
  } else if (hasCvs) {
    xml.Element("versioncontrol", "kdevcvsservice");
  }

  xml.EndElement(); // general
  xml.StartElement("kdevcustomproject");

  xml.Element("filelistdirectory", outputDir);

  xml.StartElement("run");
  xml.Element("mainprogram", executable);
  xml.Element("directoryradio", "custom");
  xml.Element("customdirectory", outputDir);
  xml.Element("programargs", "");
  xml.Element("terminal", "false");
  xml.Element("autocompile", "true");
  xml.Element("envvars");
  xml.EndElement();

  xml.StartElement("build");
  xml.Element("buildtool", "make");   // this one is important
  xml.Element("builddir", outputDir); // and this one
  xml.EndElement();

  xml.StartElement("make");
  xml.Element("abortonerror", "false");
  xml.Element("numberofjobs", 1);
  xml.Element("dontact", "false");
  xml.Element("makebin", this->GlobalGenerator->GetLocalGenerators()[0]
                           ->GetMakefile()
                           ->GetRequiredDefinition("CMAKE_MAKE_PROGRAM"));
  xml.Element("selectedenvironment", "default");

  xml.StartElement("environments");
  xml.StartElement("default");

  xml.StartElement("envvar");
  xml.Attribute("value", 1);
  xml.Attribute("name", "VERBOSE");
  xml.EndElement();

  xml.StartElement("envvar");
  xml.Attribute("value", 1);
  xml.Attribute("name", "CMAKE_NO_VERBOSE");
  xml.EndElement();

  xml.EndElement(); // default
  xml.EndElement(); // environments
  xml.EndElement(); // make

  xml.StartElement("blacklist");
  for (std::vector<std::string>::const_iterator dirIt =
         this->Blacklist.begin();
       dirIt != this->Blacklist.end(); ++dirIt) {
    xml.Element("path", *dirIt);
  }
  xml.EndElement();

  xml.EndElement(); // kdevcustomproject

  xml.StartElement("kdevfilecreate");
  xml.Element("filetypes");
  xml.StartElement("useglobaltypes");

  xml.StartElement("type");
  xml.Attribute("ext", "ui");
  xml.EndElement();

  xml.StartElement("type");
  xml.Attribute("ext", "cpp");
  xml.EndElement();

  xml.StartElement("type");
  xml.Attribute("ext", "h");
  xml.EndElement();

  xml.EndElement(); // useglobaltypes
  xml.EndElement(); // kdevfilecreate

  xml.StartElement("kdevdoctreeview");
  xml.StartElement("projectdoc");
  xml.Element("userdocDir", "html/");
  xml.Element("apidocDir", "html/");
  xml.EndElement(); // projectdoc
  xml.Element("ignoreqt_xml");
  xml.Element("ignoredoxygen");
  xml.Element("ignorekdocs");
  xml.Element("ignoretocs");
  xml.Element("ignoredevhelp");
  xml.EndElement(); // kdevdoctreeview;

  if (enableCxx) {
    xml.StartElement("cppsupportpart");
    xml.StartElement("filetemplates");
    xml.Element("interfacesuffix", ".h");
    xml.Element("implementationsuffix", ".cpp");
    xml.EndElement(); // filetemplates
    xml.EndElement(); // cppsupportpart

    xml.StartElement("kdevcppsupport");
    xml.StartElement("codecompletion");
    xml.Element("includeGlobalFunctions", "true");
    xml.Element("includeTypes", "true");
    xml.Element("includeEnums", "true");
    xml.Element("includeTypedefs", "false");
    xml.Element("automaticCodeCompletion", "true");
    xml.Element("automaticArgumentsHint", "true");
    xml.Element("automaticHeaderCompletion", "true");
    xml.Element("codeCompletionDelay", 250);
    xml.Element("argumentsHintDelay", 400);
    xml.Element("headerCompletionDelay", 250);
    xml.EndElement(); // codecompletion
    xml.Element("references");
    xml.EndElement(); // kdevcppsupport;
  }

  if (enableFortran) {
    xml.StartElement("kdevfortransupport");
    xml.StartElement("ftnchek");
    xml.Element("division", "false");
    xml.Element("extern", "false");
    xml.Element("declare", "false");
    xml.Element("pure", "false");
    xml.Element("argumentsall", "false");
    xml.Element("commonall", "false");
    xml.Element("truncationall", "false");
    xml.Element("usageall", "false");
    xml.Element("f77all", "false");
    xml.Element("portabilityall", "false");
    xml.Element("argumentsonly");
    xml.Element("commononly");
    xml.Element("truncationonly");
    xml.Element("usageonly");
    xml.Element("f77only");
    xml.Element("portabilityonly");
    xml.EndElement(); // ftnchek
    xml.EndElement(); // kdevfortransupport;
  }

  // set up file groups. maybe this can be used with the CMake SOURCE_GROUP()
  // command
  xml.StartElement("kdevfileview");
  xml.StartElement("groups");

  xml.StartElement("group");
  xml.Attribute("pattern", cmakeFilePattern);
  xml.Attribute("name", "CMake");
  xml.EndElement();

  if (enableCxx) {
    xml.StartElement("group");
    xml.Attribute("pattern", "*.h;*.hxx;*.hpp");
    xml.Attribute("name", "Header");
    xml.EndElement();

    xml.StartElement("group");
    xml.Attribute("pattern", "*.c");
    xml.Attribute("name", "C Sources");
    xml.EndElement();

    xml.StartElement("group");
    xml.Attribute("pattern", "*.cpp;*.C;*.cxx;*.cc");
    xml.Attribute("name", "C++ Sources");
    xml.EndElement();
  }

  if (enableFortran) {
    xml.StartElement("group");
    xml.Attribute("pattern",
                  "*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;*.F95");
    xml.Attribute("name", "Fortran Sources");
    xml.EndElement();
  }

  xml.StartElement("group");
  xml.Attribute("pattern", "*.ui");
  xml.Attribute("name", "Qt Designer files");
  xml.EndElement();

  xml.Element("hidenonprojectfiles", "true");
  xml.EndElement(); // groups

  xml.StartElement("tree");
  xml.Element("hidepatterns", "*.o,*.lo,CVS,*~,cmake*");
  xml.Element("hidenonprojectfiles", "true");
  xml.EndElement(); // tree

  xml.EndElement(); // kdevfileview
  xml.EndElement(); // kdevelop;
  xml.EndDocument();

  if (sessionFilename.empty()) {
    return;
  }

  // and a session file, so that kdevelop opens a file if it opens the
  // project the first time
  cmGeneratedFileStream devses(sessionFilename.c_str());
  if (!devses) {
    return;
  }
  cmXMLWriter sesxml(devses);
  sesxml.StartDocument("UTF-8");
  sesxml.Doctype("KDevPrjSession");
  sesxml.StartElement("KDevPrjSession");

  sesxml.StartElement("DocsAndViews");
  sesxml.Attribute("NumberOfDocuments", 1);

  sesxml.StartElement("Doc0");
  sesxml.Attribute("NumberOfViews", 1);
  sesxml.Attribute("URL", "file://" + fileToOpen);

  sesxml.StartElement("View0");
  sesxml.Attribute("line", 0);
  sesxml.Attribute("Type", "Source");
  sesxml.EndElement(); // View0

  sesxml.EndElement(); // Doc0
  sesxml.EndElement(); // DocsAndViews
  sesxml.EndElement(); // KDevPrjSession;
}